

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4-compression.cc
# Opt level: O0

size_t tinyusdz::LZ4Compression::CompressToBuffer
                 (char *input,char *compressed,size_t inputSize,string *err)

{
  char *src;
  int iVar1;
  size_t sVar2;
  char *dst;
  size_t local_180;
  size_t chunk;
  __cxx11 local_170 [7];
  anon_class_1_0_00000001 writeChunk;
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  ulong local_110;
  size_t numChunks;
  size_t partChunkSz;
  size_t nWholeChunks;
  char *origCompressed;
  __cxx11 local_d0 [32];
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  string *local_30;
  string *err_local;
  size_t inputSize_local;
  char *compressed_local;
  char *input_local;
  
  local_30 = err;
  err_local = (string *)inputSize;
  inputSize_local = (size_t)compressed;
  compressed_local = input;
  sVar2 = GetMaxInputSize();
  src = compressed_local;
  if (sVar2 < inputSize) {
    if (local_30 != (string *)0x0) {
      std::__cxx11::to_string(local_d0,(unsigned_long)err_local);
      ::std::operator+((char *)local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Attempted to compress a buffer of ");
      ::std::operator+(local_90,(char *)local_b0);
      sVar2 = GetMaxInputSize();
      std::__cxx11::to_string((__cxx11 *)&origCompressed,sVar2);
      ::std::operator+(local_70,local_90);
      ::std::operator+(local_50,(char *)local_70);
      ::std::__cxx11::string::operator=((string *)local_30,(string *)local_50);
      ::std::__cxx11::string::~string((string *)local_50);
      ::std::__cxx11::string::~string((string *)local_70);
      ::std::__cxx11::string::~string((string *)&origCompressed);
      ::std::__cxx11::string::~string((string *)local_90);
      ::std::__cxx11::string::~string(local_b0);
      ::std::__cxx11::string::~string((string *)local_d0);
    }
    input_local = (char *)0x0;
  }
  else {
    nWholeChunks = inputSize_local;
    if (err_local < (string *)0x7e000001) {
      *(undefined1 *)inputSize_local = 0;
      dst = (char *)(inputSize_local + 1);
      iVar1 = (int)err_local;
      sVar2 = GetCompressedBufferSize((size_t)err_local);
      iVar1 = LZ4_compress_default(src,dst,iVar1,(int)sVar2);
      inputSize_local = inputSize_local + (long)(iVar1 + 1);
    }
    else {
      partChunkSz = (ulong)err_local / 0x7e000000;
      numChunks = (ulong)err_local % 0x7e000000;
      local_110 = partChunkSz + (long)(int)(uint)(numChunks != 0);
      if (0x7f < local_110) {
        if (local_30 != (string *)0x0) {
          std::__cxx11::to_string(local_170,local_110);
          ::std::operator+((char *)local_150,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "# of chunks must be less than 127 but got ");
          ::std::operator+(local_130,(char *)local_150);
          ::std::__cxx11::string::operator=((string *)local_30,(string *)local_130);
          ::std::__cxx11::string::~string((string *)local_130);
          ::std::__cxx11::string::~string(local_150);
          ::std::__cxx11::string::~string((string *)local_170);
        }
        return 0;
      }
      *(char *)inputSize_local = (char)local_110;
      inputSize_local = inputSize_local + 1;
      for (local_180 = 0; local_180 != partChunkSz; local_180 = local_180 + 1) {
        CompressToBuffer::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((long)&chunk + 7),&compressed_local,
                   (char **)&inputSize_local,0x7e000000);
      }
      if (numChunks != 0) {
        CompressToBuffer::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((long)&chunk + 7),&compressed_local,
                   (char **)&inputSize_local,numChunks);
      }
    }
    input_local = (char *)(inputSize_local - nWholeChunks);
  }
  return (size_t)input_local;
}

Assistant:

size_t LZ4Compression::CompressToBuffer(char const *input, char *compressed,
                                        size_t inputSize, std::string *err) {
  if (inputSize > GetMaxInputSize()) {
    if (err) {
      (*err) = "Attempted to compress a buffer of " +
               std::to_string(inputSize) +
               " bytes, "
               "more than the maximum supported " +
               std::to_string(GetMaxInputSize()) + "\n";
    }
    return 0;
  }

  // If it fits in one chunk, just do it.
  char const *const origCompressed = compressed;
  if (inputSize <= LZ4_MAX_INPUT_SIZE) {
    compressed[0] = 0;  // < zero byte means one chunk.
    compressed += 1 + LZ4_compress_default(input, compressed + 1, int(inputSize),
                                           int(GetCompressedBufferSize(inputSize)));
  } else {
    size_t nWholeChunks = inputSize / LZ4_MAX_INPUT_SIZE;
    size_t partChunkSz = inputSize % LZ4_MAX_INPUT_SIZE;
    size_t numChunks = nWholeChunks + (partChunkSz ? 1 : 0);

    if (numChunks > 127) {
      if (err) {
        (*err) = "# of chunks must be less than 127 but got " + std::to_string(numChunks) + "\n";
      }
      return 0;
    }
    *compressed++ = char(numChunks);
    auto writeChunk = [](char const *&_input, char *&_output, size_t size) {
      char *o = _output;
      _output += sizeof(int32_t);
      int32_t n =
          LZ4_compress_default(_input, _output, int(size), LZ4_compressBound(int(size)));
      memcpy(o, &n, sizeof(n));
      _output += n;
      _input += size;
    };
    for (size_t chunk = 0; chunk != nWholeChunks; ++chunk) {
      writeChunk(input, compressed, LZ4_MAX_INPUT_SIZE);
    }
    if (partChunkSz) {
      writeChunk(input, compressed, partChunkSz);
    }
  }

  return size_t(compressed - origCompressed);
}